

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

void __thiscall camp::EnumNameNotFound::~EnumNameNotFound(EnumNameNotFound *this)

{
  EnumNameNotFound *this_local;
  
  ~EnumNameNotFound(this);
  operator_delete(this);
  return;
}

Assistant:

class CAMP_API EnumNameNotFound : public Error
{
public:

    /**
     * \brief Constructor
     *
     * \param name Name of the requested metaenum member
     * \param enumName Name of the owner metaenum
     */
    EnumNameNotFound(const std::string& name, const std::string& enumName);
}